

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DontMultOut(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *this,EExpr *el,EExpr *er)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  bool bVar1;
  int iVar2;
  QuadAndLinTerms *in_RCX;
  QuadAndLinTerms *in_RDX;
  allocator_type *in_RSI;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_RDI;
  double in_stack_000000c8;
  QuadTerms *in_stack_000000d0;
  LinTerms *in_stack_000000d8;
  EExpr *in_stack_000000e0;
  int resvar2;
  int resvar1;
  LinTerms *erlt;
  LinTerms *ellt;
  EExpr *in_stack_fffffffffffffd28;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffd30;
  QuadTerms *this_00;
  undefined4 in_stack_fffffffffffffd40;
  AlgebraicExpression<mp::QuadAndLinTerms> *this_01;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  int iVar3;
  iterator in_stack_fffffffffffffd68;
  vector<double,_std::allocator<double>_> *c;
  size_type in_stack_fffffffffffffd70;
  QuadTerms *this_02;
  QuadTerms local_26d;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_38;
  int local_34;
  LinTerms *local_30;
  LinTerms *local_28;
  QuadAndLinTerms *local_20;
  QuadAndLinTerms *local_18;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = QuadAndLinTerms::GetLinTerms(in_RDX);
  local_30 = QuadAndLinTerms::GetLinTerms(local_20);
  QuadAndLinTerms::sort_terms((QuadAndLinTerms *)in_stack_fffffffffffffd30);
  QuadAndLinTerms::sort_terms((QuadAndLinTerms *)in_stack_fffffffffffffd30);
  local_34 = Convert2Var(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  iVar2 = local_34;
  if ((local_18 != local_20) &&
     (bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::operator==(this_01,in_RDI), iVar2 = local_34
     , !bVar1)) {
    iVar2 = Convert2Var(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_48 = 0;
  local_38 = iVar2;
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffd30);
  local_26d.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  m_storage.m_data._45_8_ = 0x3ff0000000000000;
  local_26d.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  m_storage.m_data[3]._5_8_ =
       (long)local_26d.folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.m_storage.m_data + 0x2d;
  local_26d.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  m_storage.m_data._61_8_ = 1;
  std::allocator<double>::allocator((allocator<double> *)0x3bc29d);
  __l._M_len = in_stack_fffffffffffffd70;
  __l._M_array = in_stack_fffffffffffffd68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),__l,in_RSI);
  local_26d.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr.
  _1_4_ = local_34;
  local_26d.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>._5_8_ =
       (long)&local_26d.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_data_ptr + 1;
  local_26d.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>._13_8_ = 1;
  this_00 = &local_26d;
  std::allocator<int>::allocator((allocator<int> *)0x3bc2ee);
  __l_00._M_len = in_stack_fffffffffffffd70;
  __l_00._M_array = (iterator)in_stack_fffffffffffffd68;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),__l_00,
             (allocator_type *)in_RSI);
  c = (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffd64;
  this_02 = (QuadTerms *)0x1;
  iVar3 = local_38;
  std::allocator<int>::allocator((allocator<int> *)0x3bc338);
  __l_01._M_len = (size_type)this_02;
  __l_01._M_array = (iterator)c;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar3,in_stack_fffffffffffffd60),__l_01,
             (allocator_type *)in_RSI);
  QuadTerms::QuadTerms
            (this_02,c,
             (vector<int,_std::allocator<int>_> *)CONCAT44(iVar3,in_stack_fffffffffffffd60),
             (vector<int,_std::allocator<int>_> *)in_RSI);
  EExpr::EExpr(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  QuadTerms::~QuadTerms(this_00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_fffffffffffffd40));
  std::allocator<int>::~allocator((allocator<int> *)0x3bc3b6);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_fffffffffffffd40));
  std::allocator<int>::~allocator((allocator<int> *)0x3bc3cd);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffd40));
  std::allocator<double>::~allocator((allocator<double> *)0x3bc3e7);
  LinTerms::~LinTerms((LinTerms *)this_00);
  return (EExpr *)this_01;
}

Assistant:

EExpr DontMultOut(EExpr&& el, EExpr&& er) {
    const auto& ellt = el.GetLinTerms();
    const auto& erlt = er.GetLinTerms();
    assert(el.is_affine() && er.is_affine()
           && ellt.size() && erlt.size());
    el.sort_terms();
    er.sort_terms();
    auto resvar1 = Convert2Var( std::move(el) );
    auto resvar2 = (&el==&er || el==er)
                       ? resvar1 : Convert2Var( std::move(er) );
    return {                         // = el*er+0, inlined  #260
            LinTerms{},
            QuadTerms{ {1.0}, {resvar1}, {resvar2} },
            0.0 };
  }